

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_extract(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  int f;
  lua_Unsigned r;
  lua_State *plStack_10;
  int w;
  lua_State *L_local;
  
  plStack_10 = L;
  uVar2 = luaL_checkinteger(L,1);
  iVar1 = fieldargs(plStack_10,2,(int *)((long)&r + 4));
  lua_pushinteger(plStack_10,
                  (uVar2 & 0xffffffff) >> ((byte)iVar1 & 0x3f) &
                  (0x1fffffffe << (r._4_1_ - 1U & 0x3f) ^ 0xffffffffffffffffU));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  pushunsigned(L, r);
  return 1;
}